

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int spiRead(uint handle,char *buf,uint count)

{
  ulong uVar1;
  FILE *__stream;
  
  __stream = _stderr;
  uVar1 = (ulong)handle;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(count,buf);
    fprintf(__stream,"%s %s: handle=%d count=%d [%s]\n",myTimeStamp::buf,"spiRead",uVar1,
            (ulong)count,myBuf2Str::str);
  }
  if (libInitialised == '\0') {
    count = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      spiRead_cold_1();
    }
  }
  else if (handle < 0x20) {
    if (spiInfo[uVar1].state == 2) {
      if (count < 0x10001) {
        spiGo(spiInfo[uVar1].speed,spiInfo[uVar1].flags,(char *)0x0,buf,count);
      }
      else {
        count = 0xffffffac;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          spiRead_cold_3();
        }
      }
    }
    else {
      count = 0xffffffe7;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        spiRead_cold_2();
      }
    }
  }
  else {
    count = 0xffffffe7;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      spiRead_cold_4();
    }
  }
  return count;
}

Assistant:

int spiRead(unsigned handle, char *buf, unsigned count)
{
   DBG(DBG_USER, "handle=%d count=%d [%s]",
      handle, count, myBuf2Str(count, buf));

   CHECK_INITED;

   if (handle >= PI_SPI_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (spiInfo[handle].state != PI_SPI_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (count > PI_MAX_SPI_DEVICE_COUNT)
      SOFT_ERROR(PI_BAD_SPI_COUNT, "bad count (%d)", count);

   spiGo(spiInfo[handle].speed, spiInfo[handle].flags, NULL, buf, count);

   return count;
}